

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_handle.cpp
# Opt level: O2

void __thiscall duckdb::BlockHandle::~BlockHandle(BlockHandle *this)

{
  unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *this_00;
  int iVar1;
  undefined4 extraout_var;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> _Var2;
  
  this->unswizzled = (char *)0x0;
  this_00 = &this->buffer;
  _Var2._M_head_impl =
       (this->buffer).super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>
       ._M_t.super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
       super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl;
  if ((_Var2._M_head_impl != (FileBuffer *)0x0) && (this->buffer_type != TINY_BUFFER)) {
    iVar1 = (*this->block_manager->buffer_manager->_vptr_BufferManager[0x1f])();
    BufferPool::IncrementDeadNodes((BufferPool *)CONCAT44(extraout_var,iVar1),this);
    _Var2._M_head_impl =
         (this_00->super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>).
         _M_t.super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>
         .super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl;
  }
  if ((_Var2._M_head_impl != (FileBuffer *)0x0) && ((this->state)._M_i == BLOCK_LOADED)) {
    _Var2._M_head_impl =
         (this_00->super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>).
         _M_t.super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>
         .super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl;
    (this_00->super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)._M_t.
    super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
    super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl = (FileBuffer *)0x0;
    if (_Var2._M_head_impl != (FileBuffer *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_FileBuffer + 8))();
    }
    BufferPoolReservation::Resize(&this->memory_charge,0);
  }
  BlockManager::UnregisterBlock(this->block_manager,this);
  BufferPoolReservation::~BufferPoolReservation(&this->memory_charge);
  ::std::unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>::~unique_ptr
            (&this_00->
              super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.internal.
              super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

BlockHandle::~BlockHandle() { // NOLINT: allow internal exceptions
	// being destroyed, so any unswizzled pointers are just binary junk now.
	unswizzled = nullptr;
	D_ASSERT(!buffer || buffer->GetBufferType() == buffer_type);
	if (buffer && buffer_type != FileBufferType::TINY_BUFFER) {
		// we kill the latest version in the eviction queue
		auto &buffer_manager = block_manager.buffer_manager;
		buffer_manager.GetBufferPool().IncrementDeadNodes(*this);
	}

	// no references remain to this block: erase
	if (buffer && state == BlockState::BLOCK_LOADED) {
		D_ASSERT(memory_charge.size > 0);
		// the block is still loaded in memory: erase it
		buffer.reset();
		memory_charge.Resize(0);
	} else {
		D_ASSERT(memory_charge.size == 0);
	}
	try {
		block_manager.UnregisterBlock(*this);
	} catch (...) {
	}
}